

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralMatrixVector.h
# Opt level: O1

void Eigen::internal::general_matrix_vector_product<long,_double,_0,_false,_double,_false,_0>::run
               (long rows,long cols,double *lhs,long lhsStride,double *rhs,long rhsIncr,
               ResScalar *res,long resIncr,double alpha)

{
  long lVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  ulong uVar5;
  long lVar6;
  double *pdVar7;
  long lVar8;
  long lVar9;
  double *pdVar10;
  ulong uVar11;
  long lVar12;
  double *pdVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  double *pdVar17;
  double *pdVar18;
  ulong uVar19;
  long lVar20;
  double *pdVar21;
  double dVar22;
  double dVar23;
  double *local_d0;
  ulong local_b0;
  double *local_90;
  
  uVar16 = (ulong)((uint)((ulong)res >> 3) & 1);
  if (rows <= (long)uVar16) {
    uVar16 = rows;
  }
  if (((ulong)res & 7) != 0) {
    uVar16 = rows;
  }
  uVar5 = (ulong)((uint)lhsStride & 1);
  uVar11 = (ulong)((uint)((ulong)lhs >> 3) & 1);
  if (rows <= (long)uVar11) {
    uVar11 = rows;
  }
  if (((ulong)lhs & 7) != 0) {
    uVar11 = rows;
  }
  local_b0 = uVar5;
  if ((((uint)res | (uint)lhs) & 7) == 0) {
    lVar15 = (rows - uVar16 & 0xfffffffffffffffe) + uVar16;
    lVar14 = 0;
    do {
      if (uVar16 == (long)uVar11 % 2) goto LAB_001076b4;
      lVar14 = lVar14 + 1;
      uVar11 = uVar11 + uVar5;
    } while (lVar14 == 1);
    lVar14 = 2;
LAB_001076b4:
    if (lVar14 == 2) {
      local_b0 = 3;
      lVar14 = 0;
    }
    else if (cols <= lVar14) {
      lVar14 = cols;
    }
  }
  else {
    lVar15 = 0;
    uVar16 = 0;
    lVar14 = 0;
  }
  uVar19 = cols - lVar14;
  uVar11 = uVar19 + 3;
  if (-1 < (long)uVar19) {
    uVar11 = uVar19;
  }
  lVar9 = (uVar11 & 0xfffffffffffffffc) + lVar14;
  if (3 < (long)uVar19) {
    lVar12 = uVar5 * 2 + 1;
    lVar1 = (ulong)(uVar5 == 0) * 2 + 1;
    lVar20 = (lVar1 + lVar14) * lhsStride;
    pdVar13 = lhs + lVar20;
    lVar8 = (lVar14 + 2) * lhsStride;
    pdVar10 = lhs + lVar8;
    lVar6 = (lVar12 + lVar14) * lhsStride;
    pdVar17 = lhs + lVar6;
    pdVar18 = lhs + lVar14 * lhsStride;
    pdVar21 = lhs + lVar20 + lVar15;
    local_90 = lhs + lVar8 + lVar15;
    local_d0 = lhs + lVar6 + lVar15;
    pdVar7 = lhs + lVar14 * lhsStride + lVar15;
    lVar6 = lVar14;
    do {
      dVar22 = rhs[lVar6 * rhsIncr];
      dVar2 = rhs[(lVar6 + lVar12) * rhsIncr];
      dVar3 = rhs[(lVar6 + 2) * rhsIncr];
      dVar4 = rhs[(lVar1 + lVar6) * rhsIncr];
      if (0 < (long)uVar16) {
        uVar11 = 0;
        do {
          dVar23 = pdVar18[uVar11] * dVar22 * alpha + res[uVar11];
          res[uVar11] = dVar23;
          dVar23 = pdVar17[uVar11] * dVar2 * alpha + dVar23;
          res[uVar11] = dVar23;
          dVar23 = pdVar10[uVar11] * dVar3 * alpha + dVar23;
          res[uVar11] = dVar23;
          res[uVar11] = pdVar13[uVar11] * dVar4 * alpha + dVar23;
          uVar11 = uVar11 + 1;
        } while (uVar16 != uVar11);
      }
      if ((long)uVar16 < lVar15) {
        (*(code *)(&DAT_00112ad8 + *(int *)(&DAT_00112ad8 + local_b0 * 4)))();
        return;
      }
      if (lVar15 < rows) {
        lVar8 = 0;
        do {
          dVar23 = pdVar7[lVar8] * dVar22 * alpha + res[lVar15 + lVar8];
          res[lVar15 + lVar8] = dVar23;
          dVar23 = local_d0[lVar8] * dVar2 * alpha + dVar23;
          res[lVar15 + lVar8] = dVar23;
          dVar23 = local_90[lVar8] * dVar3 * alpha + dVar23;
          res[lVar15 + lVar8] = dVar23;
          res[lVar15 + lVar8] = pdVar21[lVar8] * dVar4 * alpha + dVar23;
          lVar8 = lVar8 + 1;
        } while (rows - lVar15 != lVar8);
      }
      lVar6 = lVar6 + 4;
      pdVar13 = pdVar13 + lhsStride * 4;
      pdVar10 = pdVar10 + lhsStride * 4;
      pdVar17 = pdVar17 + lhsStride * 4;
      pdVar18 = pdVar18 + lhsStride * 4;
      pdVar21 = pdVar21 + lhsStride * 4;
      local_90 = local_90 + lhsStride * 4;
      local_d0 = local_d0 + lhsStride * 4;
      pdVar7 = pdVar7 + lhsStride * 4;
    } while (lVar6 < lVar9);
  }
  do {
    lVar12 = lVar14;
    if (lVar9 < cols) {
      pdVar13 = (double *)(lhsStride * 8 * lVar9 + (long)lhs);
      do {
        dVar22 = rhs[lVar9 * rhsIncr] * alpha;
        if (0 < (long)uVar16) {
          uVar11 = 0;
          do {
            res[uVar11] = pdVar13[uVar11] * dVar22 + res[uVar11];
            uVar11 = uVar11 + 1;
          } while (uVar16 != uVar11);
        }
        uVar11 = uVar16;
        if (((uint)lhs + (int)lVar9 * (uint)lhsStride * 8 + (int)uVar16 * 8 & 0xf) == 0) {
          for (; (long)uVar11 < lVar15; uVar11 = uVar11 + 2) {
            dVar3 = (pdVar13 + uVar11)[1];
            dVar2 = (res + uVar11)[1];
            res[uVar11] = pdVar13[uVar11] * dVar22 + res[uVar11];
            (res + uVar11)[1] = dVar3 * dVar22 + dVar2;
          }
        }
        else {
          for (; (long)uVar11 < lVar15; uVar11 = uVar11 + 2) {
            dVar3 = (pdVar13 + uVar11)[1];
            dVar2 = (res + uVar11)[1];
            res[uVar11] = pdVar13[uVar11] * dVar22 + res[uVar11];
            (res + uVar11)[1] = dVar3 * dVar22 + dVar2;
          }
        }
        lVar14 = lVar15;
        if (lVar15 < rows) {
          do {
            res[lVar14] = pdVar13[lVar14] * dVar22 + res[lVar14];
            lVar14 = lVar14 + 1;
          } while (rows != lVar14);
        }
        lVar9 = lVar9 + 1;
        pdVar13 = pdVar13 + lhsStride;
      } while (lVar9 != cols);
    }
    lVar9 = 0;
    lVar14 = 0;
    cols = lVar12;
  } while (lVar12 != 0);
  return;
}

Assistant:

EIGEN_DONT_INLINE void general_matrix_vector_product<Index,LhsScalar,ColMajor,ConjugateLhs,RhsScalar,ConjugateRhs,Version>::run(
  Index rows, Index cols,
  const LhsScalar* lhs, Index lhsStride,
  const RhsScalar* rhs, Index rhsIncr,
  ResScalar* res, Index resIncr, RhsScalar alpha)
{
  EIGEN_UNUSED_VARIABLE(resIncr)
  eigen_internal_assert(resIncr==1);
  #ifdef _EIGEN_ACCUMULATE_PACKETS
  #error _EIGEN_ACCUMULATE_PACKETS has already been defined
  #endif
  #define _EIGEN_ACCUMULATE_PACKETS(A0,A13,A2) \
    pstore(&res[j], \
      padd(pload<ResPacket>(&res[j]), \
        padd( \
          padd(pcj.pmul(EIGEN_CAT(ploa , A0)<LhsPacket>(&lhs0[j]),    ptmp0), \
                  pcj.pmul(EIGEN_CAT(ploa , A13)<LhsPacket>(&lhs1[j]),   ptmp1)), \
          padd(pcj.pmul(EIGEN_CAT(ploa , A2)<LhsPacket>(&lhs2[j]),    ptmp2), \
                  pcj.pmul(EIGEN_CAT(ploa , A13)<LhsPacket>(&lhs3[j]),   ptmp3)) )))

  conj_helper<LhsScalar,RhsScalar,ConjugateLhs,ConjugateRhs> cj;
  conj_helper<LhsPacket,RhsPacket,ConjugateLhs,ConjugateRhs> pcj;
  if(ConjugateRhs)
    alpha = numext::conj(alpha);

  enum { AllAligned = 0, EvenAligned, FirstAligned, NoneAligned };
  const Index columnsAtOnce = 4;
  const Index peels = 2;
  const Index LhsPacketAlignedMask = LhsPacketSize-1;
  const Index ResPacketAlignedMask = ResPacketSize-1;
//  const Index PeelAlignedMask = ResPacketSize*peels-1;
  const Index size = rows;
  
  // How many coeffs of the result do we have to skip to be aligned.
  // Here we assume data are at least aligned on the base scalar type.
  Index alignedStart = internal::first_aligned(res,size);
  Index alignedSize = ResPacketSize>1 ? alignedStart + ((size-alignedStart) & ~ResPacketAlignedMask) : 0;
  const Index peeledSize = alignedSize - RhsPacketSize*peels - RhsPacketSize + 1;

  const Index alignmentStep = LhsPacketSize>1 ? (LhsPacketSize - lhsStride % LhsPacketSize) & LhsPacketAlignedMask : 0;
  Index alignmentPattern = alignmentStep==0 ? AllAligned
                       : alignmentStep==(LhsPacketSize/2) ? EvenAligned
                       : FirstAligned;

  // we cannot assume the first element is aligned because of sub-matrices
  const Index lhsAlignmentOffset = internal::first_aligned(lhs,size);

  // find how many columns do we have to skip to be aligned with the result (if possible)
  Index skipColumns = 0;
  // if the data cannot be aligned (TODO add some compile time tests when possible, e.g. for floats)
  if( (size_t(lhs)%sizeof(LhsScalar)) || (size_t(res)%sizeof(ResScalar)) )
  {
    alignedSize = 0;
    alignedStart = 0;
  }
  else if (LhsPacketSize>1)
  {
    eigen_internal_assert(size_t(lhs+lhsAlignmentOffset)%sizeof(LhsPacket)==0 || size<LhsPacketSize);

    while (skipColumns<LhsPacketSize &&
          alignedStart != ((lhsAlignmentOffset + alignmentStep*skipColumns)%LhsPacketSize))
      ++skipColumns;
    if (skipColumns==LhsPacketSize)
    {
      // nothing can be aligned, no need to skip any column
      alignmentPattern = NoneAligned;
      skipColumns = 0;
    }
    else
    {
      skipColumns = (std::min)(skipColumns,cols);
      // note that the skiped columns are processed later.
    }

    eigen_internal_assert(  (alignmentPattern==NoneAligned)
                      || (skipColumns + columnsAtOnce >= cols)
                      || LhsPacketSize > size
                      || (size_t(lhs+alignedStart+lhsStride*skipColumns)%sizeof(LhsPacket))==0);
  }
  else if(Vectorizable)
  {
    alignedStart = 0;
    alignedSize = size;
    alignmentPattern = AllAligned;
  }

  Index offset1 = (FirstAligned && alignmentStep==1?3:1);
  Index offset3 = (FirstAligned && alignmentStep==1?1:3);

  Index columnBound = ((cols-skipColumns)/columnsAtOnce)*columnsAtOnce + skipColumns;
  for (Index i=skipColumns; i<columnBound; i+=columnsAtOnce)
  {
    RhsPacket ptmp0 = pset1<RhsPacket>(alpha*rhs[i*rhsIncr]),
              ptmp1 = pset1<RhsPacket>(alpha*rhs[(i+offset1)*rhsIncr]),
              ptmp2 = pset1<RhsPacket>(alpha*rhs[(i+2)*rhsIncr]),
              ptmp3 = pset1<RhsPacket>(alpha*rhs[(i+offset3)*rhsIncr]);

    // this helps a lot generating better binary code
    const LhsScalar *lhs0 = lhs + i*lhsStride,     *lhs1 = lhs + (i+offset1)*lhsStride,
                    *lhs2 = lhs + (i+2)*lhsStride, *lhs3 = lhs + (i+offset3)*lhsStride;

    if (Vectorizable)
    {
      /* explicit vectorization */
      // process initial unaligned coeffs
      for (Index j=0; j<alignedStart; ++j)
      {
        res[j] = cj.pmadd(lhs0[j], pfirst(ptmp0), res[j]);
        res[j] = cj.pmadd(lhs1[j], pfirst(ptmp1), res[j]);
        res[j] = cj.pmadd(lhs2[j], pfirst(ptmp2), res[j]);
        res[j] = cj.pmadd(lhs3[j], pfirst(ptmp3), res[j]);
      }

      if (alignedSize>alignedStart)
      {
        switch(alignmentPattern)
        {
          case AllAligned:
            for (Index j = alignedStart; j<alignedSize; j+=ResPacketSize)
              _EIGEN_ACCUMULATE_PACKETS(d,d,d);
            break;
          case EvenAligned:
            for (Index j = alignedStart; j<alignedSize; j+=ResPacketSize)
              _EIGEN_ACCUMULATE_PACKETS(d,du,d);
            break;
          case FirstAligned:
          {
            Index j = alignedStart;
            if(peels>1)
            {
              LhsPacket A00, A01, A02, A03, A10, A11, A12, A13;
              ResPacket T0, T1;

              A01 = pload<LhsPacket>(&lhs1[alignedStart-1]);
              A02 = pload<LhsPacket>(&lhs2[alignedStart-2]);
              A03 = pload<LhsPacket>(&lhs3[alignedStart-3]);

              for (; j<peeledSize; j+=peels*ResPacketSize)
              {
                A11 = pload<LhsPacket>(&lhs1[j-1+LhsPacketSize]);  palign<1>(A01,A11);
                A12 = pload<LhsPacket>(&lhs2[j-2+LhsPacketSize]);  palign<2>(A02,A12);
                A13 = pload<LhsPacket>(&lhs3[j-3+LhsPacketSize]);  palign<3>(A03,A13);

                A00 = pload<LhsPacket>(&lhs0[j]);
                A10 = pload<LhsPacket>(&lhs0[j+LhsPacketSize]);
                T0  = pcj.pmadd(A00, ptmp0, pload<ResPacket>(&res[j]));
                T1  = pcj.pmadd(A10, ptmp0, pload<ResPacket>(&res[j+ResPacketSize]));

                T0  = pcj.pmadd(A01, ptmp1, T0);
                A01 = pload<LhsPacket>(&lhs1[j-1+2*LhsPacketSize]);  palign<1>(A11,A01);
                T0  = pcj.pmadd(A02, ptmp2, T0);
                A02 = pload<LhsPacket>(&lhs2[j-2+2*LhsPacketSize]);  palign<2>(A12,A02);
                T0  = pcj.pmadd(A03, ptmp3, T0);
                pstore(&res[j],T0);
                A03 = pload<LhsPacket>(&lhs3[j-3+2*LhsPacketSize]);  palign<3>(A13,A03);
                T1  = pcj.pmadd(A11, ptmp1, T1);
                T1  = pcj.pmadd(A12, ptmp2, T1);
                T1  = pcj.pmadd(A13, ptmp3, T1);
                pstore(&res[j+ResPacketSize],T1);
              }
            }
            for (; j<alignedSize; j+=ResPacketSize)
              _EIGEN_ACCUMULATE_PACKETS(d,du,du);
            break;
          }
          default:
            for (Index j = alignedStart; j<alignedSize; j+=ResPacketSize)
              _EIGEN_ACCUMULATE_PACKETS(du,du,du);
            break;
        }
      }
    } // end explicit vectorization

    /* process remaining coeffs (or all if there is no explicit vectorization) */
    for (Index j=alignedSize; j<size; ++j)
    {
      res[j] = cj.pmadd(lhs0[j], pfirst(ptmp0), res[j]);
      res[j] = cj.pmadd(lhs1[j], pfirst(ptmp1), res[j]);
      res[j] = cj.pmadd(lhs2[j], pfirst(ptmp2), res[j]);
      res[j] = cj.pmadd(lhs3[j], pfirst(ptmp3), res[j]);
    }
  }

  // process remaining first and last columns (at most columnsAtOnce-1)
  Index end = cols;
  Index start = columnBound;
  do
  {
    for (Index k=start; k<end; ++k)
    {
      RhsPacket ptmp0 = pset1<RhsPacket>(alpha*rhs[k*rhsIncr]);
      const LhsScalar* lhs0 = lhs + k*lhsStride;

      if (Vectorizable)
      {
        /* explicit vectorization */
        // process first unaligned result's coeffs
        for (Index j=0; j<alignedStart; ++j)
          res[j] += cj.pmul(lhs0[j], pfirst(ptmp0));
        // process aligned result's coeffs
        if ((size_t(lhs0+alignedStart)%sizeof(LhsPacket))==0)
          for (Index i = alignedStart;i<alignedSize;i+=ResPacketSize)
            pstore(&res[i], pcj.pmadd(pload<LhsPacket>(&lhs0[i]), ptmp0, pload<ResPacket>(&res[i])));
        else
          for (Index i = alignedStart;i<alignedSize;i+=ResPacketSize)
            pstore(&res[i], pcj.pmadd(ploadu<LhsPacket>(&lhs0[i]), ptmp0, pload<ResPacket>(&res[i])));
      }

      // process remaining scalars (or all if no explicit vectorization)
      for (Index i=alignedSize; i<size; ++i)
        res[i] += cj.pmul(lhs0[i], pfirst(ptmp0));
    }
    if (skipColumns)
    {
      start = 0;
      end = skipColumns;
      skipColumns = 0;
    }
    else
      break;
  } while(Vectorizable);
  #undef _EIGEN_ACCUMULATE_PACKETS
}